

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O2

void func_free(void)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  ostream *poVar4;
  int *three;
  int *two;
  int *one;
  
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 100;
  puVar2 = (undefined4 *)operator_new(4);
  *puVar2 = 200;
  puVar3 = (undefined4 *)operator_new(4);
  *puVar3 = 300;
  poVar4 = std::operator<<((ostream *)&std::cout,"\nMemory addresses on heap:");
  poVar4 = std::operator<<(poVar4,"\n&one=");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  poVar4 = std::operator<<(poVar4,"\n&two=");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  poVar4 = std::operator<<(poVar4,"\n&three=");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  operator_delete(puVar1,4);
  operator_delete(puVar2,4);
  operator_delete(puVar3,4);
  return;
}

Assistant:

void func_free()
{
	int* one = new int;
	*one = 100;
	int* two = new int;
	*two = 200;
	int* three = new int;
	*three = 300;

	std::cout << "\nMemory addresses on heap:"
		<< "\n&one=" << &one
		<< "\n&two=" << &two
		<< "\n&three=" << &three
		<< std::endl;

	delete one;
	delete two;
	delete three;
}